

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

Vec_Str_t *
Glucose_GenerateCubes
          (bmcg_sat_solver **pSat,Vec_Int_t *vCiSatVars,Vec_Int_t *vVar2Index,int CubeLimit)

{
  bmcg_sat_solver *pbVar1;
  Vec_Str_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pString;
  int Index;
  int status;
  int k;
  int i;
  int iVar;
  int nFinal;
  int *pFinal;
  Vec_Str_t *vCube;
  Vec_Int_t *vLits;
  Vec_Str_t *vSop;
  int nSupp;
  int nCubes;
  int fCreatePrime;
  int CubeLimit_local;
  Vec_Int_t *vVar2Index_local;
  Vec_Int_t *vCiSatVars_local;
  bmcg_sat_solver **pSat_local;
  
  nSupp = 1;
  nCubes = CubeLimit;
  _fCreatePrime = vVar2Index;
  vVar2Index_local = vCiSatVars;
  vCiSatVars_local = (Vec_Int_t *)pSat;
  vSop._0_4_ = Vec_IntSize(vCiSatVars);
  vLits = (Vec_Int_t *)Vec_StrAlloc(1000);
  vCube = (Vec_Str_t *)Vec_IntAlloc((int)vSop);
  pFinal = &Vec_StrAlloc((int)vSop + 4)->nCap;
  Vec_StrFill((Vec_Str_t *)pFinal,(int)vSop,'-');
  Vec_StrPrintF((Vec_Str_t *)pFinal," 1\n");
  for (vSop._4_4_ = 0; nCubes == 0 || vSop._4_4_ < nCubes; vSop._4_4_ = vSop._4_4_ + 1) {
    Index = 0;
    iVar2 = bmcg_sat_solver_solve(vCiSatVars_local->pArray,(int *)0x0,0);
    if (iVar2 == -1) break;
    if (iVar2 != 1) {
      __assert_fail("status == GLUCOSE_SAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                    ,0x2fb,
                    "Vec_Str_t *Glucose_GenerateCubes(bmcg_sat_solver **, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    Vec_IntClear((Vec_Int_t *)vCube);
    for (status = 0; iVar2 = Vec_IntSize(vVar2Index_local), status < iVar2; status = status + 1) {
      iVar2 = Vec_IntEntry(vVar2Index_local,status);
      p = vCube;
      iVar3 = bmcg_sat_solver_read_cex_varvalue(vCiSatVars_local->pArray,iVar2);
      iVar2 = Abc_Var2Lit(iVar2,(uint)((iVar3 != 0 ^ 0xffU) & 1));
      Vec_IntPush((Vec_Int_t *)p,iVar2);
    }
    if (nSupp == 0) {
      pbVar1 = *(bmcg_sat_solver **)vCiSatVars_local;
      piVar4 = Vec_IntArray((Vec_Int_t *)vCube);
      iVar2 = Vec_IntSize((Vec_Int_t *)vCube);
      iVar2 = bmcg_sat_solver_solve(pbVar1,piVar4,iVar2);
      if (iVar2 != -1) {
        __assert_fail("status == GLUCOSE_UNSAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                      ,0x30b,
                      "Vec_Str_t *Glucose_GenerateCubes(bmcg_sat_solver **, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      i = bmcg_sat_solver_final(*(bmcg_sat_solver **)vCiSatVars_local,(int **)&iVar);
    }
    else {
      pbVar1 = *(bmcg_sat_solver **)vCiSatVars_local;
      piVar4 = Vec_IntArray((Vec_Int_t *)vCube);
      iVar2 = Vec_IntSize((Vec_Int_t *)vCube);
      i = bmcg_sat_solver_minimize_assumptions(pbVar1,piVar4,iVar2,0);
      Vec_IntShrink((Vec_Int_t *)vCube,i);
      _iVar = Vec_IntArray((Vec_Int_t *)vCube);
      for (status = 0; status < i; status = status + 1) {
        iVar2 = Abc_LitNot(_iVar[status]);
        _iVar[status] = iVar2;
      }
    }
    Vec_StrFill((Vec_Str_t *)pFinal,(int)vSop,'-');
    for (status = 0; p_01 = _fCreatePrime, p_00 = vLits, status < i; status = status + 1) {
      iVar2 = Abc_Lit2Var(_iVar[status]);
      iVar2 = Vec_IntEntry(p_01,iVar2);
      piVar4 = pFinal;
      if (iVar2 != -1) {
        _iVar[Index] = _iVar[status];
        if (iVar2 < 0 || (int)vSop <= iVar2) {
          __assert_fail("Index >= 0 && Index < nSupp",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                        ,0x316,
                        "Vec_Str_t *Glucose_GenerateCubes(bmcg_sat_solver **, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        iVar3 = Abc_LitIsCompl(_iVar[status]);
        Vec_StrWriteEntry((Vec_Str_t *)piVar4,iVar2,(char)iVar3 + '0');
        Index = Index + 1;
      }
    }
    pString = Vec_StrArray((Vec_Str_t *)pFinal);
    Vec_StrAppend((Vec_Str_t *)p_00,pString);
    iVar2 = bmcg_sat_solver_addclause(vCiSatVars_local->pArray,_iVar,Index);
    if (iVar2 == 0) break;
  }
  Vec_IntFree((Vec_Int_t *)vCube);
  Vec_StrFree((Vec_Str_t *)pFinal);
  Vec_StrPush((Vec_Str_t *)vLits,'\0');
  return (Vec_Str_t *)vLits;
}

Assistant:

Vec_Str_t * Glucose_GenerateCubes( bmcg_sat_solver * pSat[2], Vec_Int_t * vCiSatVars, Vec_Int_t * vVar2Index, int CubeLimit )
{
    int fCreatePrime = 1;
    int nCubes, nSupp = Vec_IntSize(vCiSatVars);
    Vec_Str_t * vSop  = Vec_StrAlloc( 1000 );
    Vec_Int_t * vLits = Vec_IntAlloc( nSupp );
    Vec_Str_t * vCube = Vec_StrAlloc( nSupp + 4 );
    Vec_StrFill( vCube, nSupp, '-' );
    Vec_StrPrintF( vCube, " 1\n\0" );
    for ( nCubes = 0; !CubeLimit || nCubes < CubeLimit; nCubes++ )
    {
        int * pFinal, nFinal, iVar, i, k = 0;
        // generate onset minterm
        int status = bmcg_sat_solver_solve( pSat[1], NULL, 0 );
        if ( status == GLUCOSE_UNSAT )
            break;
        assert( status == GLUCOSE_SAT );
        Vec_IntClear( vLits );
        Vec_IntForEachEntry( vCiSatVars, iVar, i )
            Vec_IntPush( vLits, Abc_Var2Lit(iVar, !bmcg_sat_solver_read_cex_varvalue(pSat[1], iVar)) );
        // expand against offset
        if ( fCreatePrime )
        {
            nFinal = bmcg_sat_solver_minimize_assumptions( pSat[0], Vec_IntArray(vLits), Vec_IntSize(vLits), 0 );
            Vec_IntShrink( vLits, nFinal );
            pFinal = Vec_IntArray( vLits );
            for ( i = 0; i < nFinal; i++ )
                pFinal[i] = Abc_LitNot(pFinal[i]);
        }
        else
        {
            status = bmcg_sat_solver_solve( pSat[0], Vec_IntArray(vLits), Vec_IntSize(vLits) );
            assert( status == GLUCOSE_UNSAT );
            nFinal = bmcg_sat_solver_final( pSat[0], &pFinal );
        }
        // print cube
        Vec_StrFill( vCube, nSupp, '-' );
        for ( i = 0; i < nFinal; i++ )
        {
            int Index = Vec_IntEntry(vVar2Index, Abc_Lit2Var(pFinal[i]));
            if ( Index == -1 )
                continue;
            pFinal[k++] = pFinal[i];
            assert( Index >= 0 && Index < nSupp );
            Vec_StrWriteEntry( vCube, Index, (char)('0' + Abc_LitIsCompl(pFinal[i])) );
        }
        nFinal = k;
        Vec_StrAppend( vSop, Vec_StrArray(vCube) );
        //printf( "%s\n", Vec_StrArray(vCube) );
        // add blocking clause
        if ( !bmcg_sat_solver_addclause( pSat[1], pFinal, nFinal ) )
            break;
    }
    Vec_IntFree( vLits );
    Vec_StrFree( vCube );
    Vec_StrPush( vSop, '\0' );
    return vSop;
}